

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Addr> *addr,RegMap<std::shared_ptr<Register>_> *mp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  shared_ptr<mocker::nasm::Register> *psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<mocker::nasm::Addr> sVar5;
  bool local_101;
  int local_fc;
  shared_ptr<mocker::nasm::MemoryAddr> local_f8;
  shared_ptr<mocker::nasm::Register> local_e8;
  undefined1 local_d8 [8];
  shared_ptr<mocker::nasm::Register> reg2;
  undefined1 local_b8 [8];
  shared_ptr<mocker::nasm::Register> reg1;
  shared_ptr<mocker::nasm::MemoryAddr> p_1;
  shared_ptr<mocker::nasm::Register> local_90;
  undefined1 local_80 [8];
  shared_ptr<mocker::nasm::Register> p;
  shared_ptr<mocker::nasm::Addr> local_68;
  byte local_55;
  shared_ptr<mocker::nasm::Addr> local_48;
  shared_ptr<mocker::nasm::Addr> local_38;
  element_type *local_28;
  anon_class_8_1_3fcf6661 getIfExists;
  RegMap<std::shared_ptr<Register>_> *mp_local;
  shared_ptr<mocker::nasm::Addr> *addr_local;
  
  local_28 = (element_type *)mp;
  getIfExists.mp = mp;
  dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>(&local_38);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  local_55 = 0;
  p.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       0;
  local_101 = true;
  if (!bVar1) {
    dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>const&>(&local_48);
    local_55 = 1;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_48);
    local_101 = true;
    if (!bVar1) {
      dyc<mocker::nasm::Label,std::shared_ptr<mocker::nasm::Addr>const&>(&local_68);
      p.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = 1;
      local_101 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_68);
    }
  }
  if ((p.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _7_1_ & 1) != 0) {
    std::shared_ptr<mocker::nasm::Label>::~shared_ptr((shared_ptr<mocker::nasm::Label> *)&local_68);
  }
  if ((local_55 & 1) != 0) {
    std::shared_ptr<mocker::nasm::LabelAddr>::~shared_ptr
              ((shared_ptr<mocker::nasm::LabelAddr> *)&local_48);
  }
  std::shared_ptr<mocker::nasm::NumericConstant>::~shared_ptr
            ((shared_ptr<mocker::nasm::NumericConstant> *)&local_38);
  if (local_101 == false) {
    dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
              ((shared_ptr<mocker::nasm::Addr> *)local_80);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_80);
    if (bVar1) {
      replaceRegs::anon_class_8_1_3fcf6661::operator()
                ((anon_class_8_1_3fcf6661 *)&local_90,
                 (shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffd8);
      std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                ((shared_ptr<mocker::nasm::Addr> *)this,&local_90);
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_90);
    }
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)local_80);
    _Var4._M_pi = extraout_RDX_00;
    if (!bVar1) {
      dyc<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Addr>const&>
                ((shared_ptr<mocker::nasm::Addr> *)
                 &reg1.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &reg1.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
        peVar2 = std::
                 __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&reg1.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        MemoryAddr::getReg1(peVar2);
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Register>const&>
                  ((shared_ptr<mocker::nasm::Register> *)local_b8);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8);
        if (bVar1) {
          replaceRegs::anon_class_8_1_3fcf6661::operator()
                    ((anon_class_8_1_3fcf6661 *)
                     &reg2.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffd8);
        }
        else {
          peVar2 = std::
                   __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&reg1.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          psVar3 = MemoryAddr::getReg1(peVar2);
          std::shared_ptr<mocker::nasm::Register>::shared_ptr
                    ((shared_ptr<mocker::nasm::Register> *)
                     &reg2.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,psVar3);
        }
        this_00 = &reg2.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::shared_ptr<mocker::nasm::Register>::operator=
                  ((shared_ptr<mocker::nasm::Register> *)local_b8,
                   (shared_ptr<mocker::nasm::Register> *)this_00);
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)this_00);
        peVar2 = std::
                 __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&reg1.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        MemoryAddr::getReg2(peVar2);
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Register>const&>
                  ((shared_ptr<mocker::nasm::Register> *)local_d8);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d8);
        if (bVar1) {
          replaceRegs::anon_class_8_1_3fcf6661::operator()
                    ((anon_class_8_1_3fcf6661 *)&local_e8,
                     (shared_ptr<mocker::nasm::Register> *)&stack0xffffffffffffffd8);
        }
        else {
          peVar2 = std::
                   __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&reg1.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          psVar3 = MemoryAddr::getReg2(peVar2);
          std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_e8,psVar3);
        }
        std::shared_ptr<mocker::nasm::Register>::operator=
                  ((shared_ptr<mocker::nasm::Register> *)local_d8,&local_e8);
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_e8);
        peVar2 = std::
                 __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&reg1.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        local_fc = MemoryAddr::getScale(peVar2);
        peVar2 = std::
                 __shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&reg1.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        MemoryAddr::getNumber(peVar2);
        std::
        make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>&,int,int>
                  ((shared_ptr<mocker::nasm::Register> *)&local_f8,
                   (shared_ptr<mocker::nasm::Register> *)local_b8,(int *)local_d8,&local_fc);
        std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::MemoryAddr,void>
                  ((shared_ptr<mocker::nasm::Addr> *)this,&local_f8);
        std::shared_ptr<mocker::nasm::MemoryAddr>::~shared_ptr(&local_f8);
        bVar1 = true;
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)local_d8);
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)local_b8);
      }
      else {
        bVar1 = false;
      }
      std::shared_ptr<mocker::nasm::MemoryAddr>::~shared_ptr
                ((shared_ptr<mocker::nasm::MemoryAddr> *)
                 &reg1.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var4._M_pi = extraout_RDX_01;
      if (!bVar1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                      ,0xb3,
                      "std::shared_ptr<Addr> mocker::nasm::replaceRegs(const std::shared_ptr<Addr> &, const RegMap<std::shared_ptr<Register>> &)"
                     );
      }
    }
  }
  else {
    std::shared_ptr<mocker::nasm::Addr>::shared_ptr((shared_ptr<mocker::nasm::Addr> *)this,addr);
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar5.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> replaceRegs(const std::shared_ptr<Addr> &addr,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  auto getIfExists = [&mp](const std::shared_ptr<Register> &p) {
    auto iter = mp.find(p);
    if (iter == mp.end())
      return p;
    return iter->second;
  };
  if (dyc<NumericConstant>(addr) || dyc<LabelAddr>(addr) || dyc<Label>(addr))
    return addr;
  if (auto p = dyc<Register>(addr))
    return getIfExists(p);
  if (auto p = dyc<MemoryAddr>(addr)) {
    auto reg1 = dyc<Register>(p->getReg1());
    reg1 = reg1 ? getIfExists(reg1) : p->getReg1();
    auto reg2 = dyc<Register>(p->getReg2());
    reg2 = reg2 ? getIfExists(reg2) : p->getReg2();
    return std::make_shared<MemoryAddr>(reg1, reg2, p->getScale(),
                                        p->getNumber());
  }
  assert(false);
}